

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QDockAreaLayoutItem>::relocate
          (QArrayDataPointer<QDockAreaLayoutItem> *this,qsizetype offset,QDockAreaLayoutItem **data)

{
  bool bVar1;
  QDockAreaLayoutItem *in_RDX;
  long in_RSI;
  QDockAreaLayoutItem *in_RDI;
  QDockAreaLayoutItem **unaff_retaddr;
  QDockAreaLayoutItem *res;
  QDockAreaLayoutInfo *n;
  QDockAreaLayoutItem *c;
  
  n = (QDockAreaLayoutInfo *)(&in_RDI->subinfo->sep + in_RSI * 5);
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QDockAreaLayoutItem,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (QDockAreaLayoutItem *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QDockAreaLayoutItem>,QDockAreaLayoutItem_const*>
                        (unaff_retaddr,(QArrayDataPointer<QDockAreaLayoutItem> *)c), bVar1)) {
    in_RDX->widgetItem = (QLayoutItem *)(in_RSI * 0x28 + (long)in_RDX->widgetItem);
  }
  in_RDI->subinfo = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }